

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaB_setmetatable(lua_State *L)

{
  int iVar1;
  lua_State *in_RDI;
  lua_State *unaff_retaddr;
  int t;
  char *in_stack_00000058;
  int in_stack_00000064;
  lua_State *in_stack_00000068;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar1 = lua_type(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  luaL_checktype((lua_State *)CONCAT44(iVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec,
                 in_stack_ffffffffffffffe8);
  if ((iVar1 != 0) && (iVar1 != 5)) {
    luaL_argerror(in_stack_00000068,in_stack_00000064,in_stack_00000058);
  }
  iVar1 = luaL_getmetafield(in_RDI,iVar1,
                            (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if (iVar1 != 0) {
    luaL_error(in_RDI,"cannot change a protected metatable");
  }
  lua_settop(in_RDI,2);
  lua_setmetatable(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  return 1;
}

Assistant:

static int luaB_setmetatable(lua_State*L){
int t=lua_type(L,2);
luaL_checktype(L,1,5);
luaL_argcheck(L,t==0||t==5,2,
"nil or table expected");
if(luaL_getmetafield(L,1,"__metatable"))
luaL_error(L,"cannot change a protected metatable");
lua_settop(L,2);
lua_setmetatable(L,1);
return 1;
}